

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O1

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::transcode_slice
          (basisu_lowlevel_etc1s_transcoder *this,void *pDst_blocks,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint8_t *pImage_data,uint32_t image_data_size,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,bool bc1_allow_threecolor_blocks,
          basis_file_header *header,basis_slice_desc *slice_desc,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          bool astc_transcode_alpha,void *pAlpha_blocks,uint32_t output_rows_in_pixels)

{
  bool bVar1;
  
  bVar1 = transcode_slice(this,pDst_blocks,num_blocks_x,num_blocks_y,pImage_data,image_data_size,fmt
                          ,output_block_or_pixel_stride_in_bytes,bc1_allow_threecolor_blocks,
                          (header->m_tex_type).m_bytes[0] == '\x03',
                          (bool)((slice_desc->m_flags).m_bytes[0] & 1),
                          (uint)(slice_desc->m_level_index).m_bytes[0],
                          (uint)*(ushort *)(slice_desc->m_orig_width).m_bytes,
                          (uint)*(ushort *)(slice_desc->m_orig_height).m_bytes,
                          output_row_pitch_in_blocks_or_pixels,pState,astc_transcode_alpha,
                          pAlpha_blocks,output_rows_in_pixels);
  return bVar1;
}

Assistant:

bool transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
			uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, const basis_file_header& header, const basis_slice_desc& slice_desc, uint32_t output_row_pitch_in_blocks_or_pixels = 0,
			basisu_transcoder_state* pState = nullptr, bool astc_transcode_alpha = false, void* pAlpha_blocks = nullptr, uint32_t output_rows_in_pixels = 0)
		{
			return transcode_slice(pDst_blocks, num_blocks_x, num_blocks_y, pImage_data, image_data_size, fmt, output_block_or_pixel_stride_in_bytes, bc1_allow_threecolor_blocks,
				header.m_tex_type == cBASISTexTypeVideoFrames, (slice_desc.m_flags & cSliceDescFlagsHasAlpha) != 0, slice_desc.m_level_index,
				slice_desc.m_orig_width, slice_desc.m_orig_height, output_row_pitch_in_blocks_or_pixels, pState,
				astc_transcode_alpha,
				pAlpha_blocks,
				output_rows_in_pixels);
		}